

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ellispes_approach.cpp
# Opt level: O2

vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *
ellipses::cleanup_center_points
          (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *__return_storage_ptr__,
          vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *points,Mat *img,bool debug)

{
  pointer pPVar1;
  pointer pPVar2;
  Point_<int> *pPVar3;
  double dVar4;
  bool bVar5;
  undefined8 uVar6;
  ulong uVar7;
  undefined7 in_register_00000009;
  long lVar8;
  __normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
  __first;
  Point_<int> *pPVar9;
  __normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
  _Var10;
  long lVar11;
  initializer_list<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_> __l;
  allocator_type local_181;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *local_180;
  ulong local_178;
  undefined4 local_16c;
  undefined1 local_168 [8];
  undefined1 auStack_160 [16];
  undefined8 uStack_150;
  _InputArray local_140;
  RotatedRect local_128;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *local_108;
  Mat *local_100;
  undefined8 local_f8;
  undefined4 local_f0 [2];
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *local_e8;
  undefined8 local_e0;
  int local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  _Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_c0;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  local_a8;
  Mat tmp;
  
  local_16c = (undefined4)CONCAT71(in_register_00000009,debug);
  local_128.center.x = 0.0;
  local_128.center.y = 0.0;
  local_128.size.width = 0.0;
  local_128.size.height = 0.0;
  local_128.angle = 0.0;
  local_178 = 0;
  local_d8 = 0;
  uStack_d4 = 0;
  uStack_d0 = 0;
  uStack_cc = 0x406fe000;
  local_180 = points;
  local_108 = __return_storage_ptr__;
  local_100 = img;
  do {
    pPVar1 = (points->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pPVar2 = (points->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if ((local_178 == 0xc) || ((ulong)((long)pPVar2 - (long)pPVar1) < 0x29)) {
      (local_108->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
      super__Vector_impl_data._M_start = pPVar1;
      (local_108->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
      super__Vector_impl_data._M_finish = pPVar2;
      (local_108->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (points->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (points->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (points->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (points->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      return local_108;
    }
    _tmp = 0x8103000c;
    cv::fitEllipse((_InputArray *)local_168);
    local_128.center.x = local_168._0_4_;
    local_128.center.y = (float)local_168._4_4_;
    local_128.size = auStack_160._0_8_;
    local_128.angle = (float)auStack_160._8_4_;
    if ((char)local_16c != '\0') {
      cv::Mat::clone();
      local_140.sz.width = 0;
      local_140.sz.height = 0;
      local_140.flags = 0x3010000;
      local_140.obj = &tmp;
      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
                ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&local_c0,points);
      __l._M_len = 1;
      __l._M_array = (iterator)&local_c0;
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::vector(&local_a8,__l,&local_181);
      local_e0 = 0;
      local_f0[0] = 0x8104000c;
      local_e8 = &local_a8;
      cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)local_168);
      local_168 = (undefined1  [8])0x406fe00000000000;
      auStack_160 = ZEXT816(0);
      uStack_150 = 0;
      uVar6 = cv::noArray();
      local_f8 = 0;
      cv::drawContours(&local_140,local_f0,0,(_InputArray *)local_168,3,8,uVar6,0x7fffffff,&local_f8
                      );
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::~vector(&local_a8);
      std::_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~_Vector_base
                (&local_c0);
      local_140.sz.width = 0;
      local_140.sz.height = 0;
      local_140.flags = 0x3010000;
      local_140.obj = &tmp;
      cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)local_168);
      local_168._4_4_ = uStack_d4;
      local_168._0_4_ = local_d8;
      auStack_160._4_4_ = uStack_cc;
      auStack_160._0_4_ = uStack_d0;
      auStack_160._8_8_ = 0;
      uStack_150 = 0;
      cv::ellipse((_InputOutputArray *)&local_140,&local_128,(Scalar_ *)local_168,3,8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_168,"Cleanup",(allocator<char> *)&local_140);
      cv::namedWindow((string *)local_168,0);
      std::__cxx11::string::~string((string *)local_168);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_168,"Cleanup",(allocator<char> *)local_f0);
      local_140.sz.width = 0;
      local_140.sz.height = 0;
      local_140.flags = 0x1010000;
      local_140.obj = &tmp;
      cv::imshow((string *)local_168,&local_140);
      std::__cxx11::string::~string((string *)local_168);
      cv::waitKey(0);
      cv::destroyAllWindows();
      cv::Mat::~Mat(&tmp);
      auStack_160._0_4_ = local_128.size.width;
    }
    uVar7 = 8;
    if (local_178 < 8) {
      uVar7 = local_178;
    }
    _tmp = (int)ROUND(local_128.center.x);
    _Var10._M_current =
         (points->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
         super__Vector_impl_data._M_start;
    pPVar3 = (points->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    dVar4 = (double)(float)auStack_160._0_4_ * ((double)(long)uVar7 * -0.03 + 0.82);
    auStack_160._8_4_ = SUB84(dVar4,0);
    auStack_160._0_8_ = (double)(float)auStack_160._0_4_ * ((double)(long)uVar7 * 0.03 + 0.24);
    auStack_160._12_4_ = (int)((ulong)dVar4 >> 0x20);
    local_168._4_4_ = (int)ROUND(local_128.center.y);
    local_168._0_4_ = _tmp;
    lVar8 = (long)pPVar3 - (long)_Var10._M_current;
    for (lVar11 = lVar8 >> 5; points = local_180, 0 < lVar11; lVar11 = lVar11 + -1) {
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<ellipses::cleanup_center_points(std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::Mat_const&,bool)::$_0>
              ::operator()((_Iter_pred<ellipses::cleanup_center_points(std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::Mat_const&,bool)::__0>
                            *)&tmp,_Var10);
      __first._M_current = _Var10._M_current;
      points = local_180;
      if (bVar5) goto LAB_00118360;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<ellipses::cleanup_center_points(std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::Mat_const&,bool)::$_0>
              ::operator()((_Iter_pred<ellipses::cleanup_center_points(std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::Mat_const&,bool)::__0>
                            *)&tmp,_Var10._M_current + 1);
      __first._M_current = _Var10._M_current + 1;
      points = local_180;
      if (bVar5) goto LAB_00118360;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<ellipses::cleanup_center_points(std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::Mat_const&,bool)::$_0>
              ::operator()((_Iter_pred<ellipses::cleanup_center_points(std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::Mat_const&,bool)::__0>
                            *)&tmp,_Var10._M_current + 2);
      __first._M_current = _Var10._M_current + 2;
      points = local_180;
      if (bVar5) goto LAB_00118360;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<ellipses::cleanup_center_points(std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::Mat_const&,bool)::$_0>
              ::operator()((_Iter_pred<ellipses::cleanup_center_points(std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::Mat_const&,bool)::__0>
                            *)&tmp,_Var10._M_current + 3);
      __first._M_current = _Var10._M_current + 3;
      points = local_180;
      if (bVar5) goto LAB_00118360;
      _Var10._M_current = _Var10._M_current + 4;
      lVar8 = lVar8 + -0x20;
    }
    lVar8 = lVar8 >> 3;
    if (lVar8 == 1) {
LAB_00118342:
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<ellipses::cleanup_center_points(std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::Mat_const&,bool)::$_0>
              ::operator()((_Iter_pred<ellipses::cleanup_center_points(std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::Mat_const&,bool)::__0>
                            *)&tmp,_Var10);
      __first._M_current = _Var10._M_current;
      if (!bVar5) {
        __first._M_current = pPVar3;
      }
LAB_00118360:
      uVar7 = local_178;
      _Var10._M_current = __first._M_current;
      if (__first._M_current != pPVar3) {
        while (pPVar9 = _Var10._M_current, _Var10._M_current = pPVar9 + 1,
              _Var10._M_current != pPVar3) {
          bVar5 = __gnu_cxx::__ops::
                  _Iter_pred<ellipses::cleanup_center_points(std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::Mat_const&,bool)::$_0>
                  ::operator()((_Iter_pred<ellipses::cleanup_center_points(std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::Mat_const&,bool)::__0>
                                *)local_168,_Var10);
          if (!bVar5) {
            (__first._M_current)->x = (_Var10._M_current)->x;
            (__first._M_current)->y = pPVar9[1].y;
            __first._M_current = __first._M_current + 1;
          }
        }
      }
    }
    else {
      if (lVar8 == 2) {
LAB_0011832f:
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<ellipses::cleanup_center_points(std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::Mat_const&,bool)::$_0>
                ::operator()((_Iter_pred<ellipses::cleanup_center_points(std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::Mat_const&,bool)::__0>
                              *)&tmp,_Var10);
        __first._M_current = _Var10._M_current;
        if (!bVar5) {
          _Var10._M_current = _Var10._M_current + 1;
          goto LAB_00118342;
        }
        goto LAB_00118360;
      }
      uVar7 = local_178;
      __first._M_current = pPVar3;
      if (lVar8 == 3) {
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<ellipses::cleanup_center_points(std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::Mat_const&,bool)::$_0>
                ::operator()((_Iter_pred<ellipses::cleanup_center_points(std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::Mat_const&,bool)::__0>
                              *)&tmp,_Var10);
        __first._M_current = _Var10._M_current;
        if (!bVar5) {
          _Var10._M_current = _Var10._M_current + 1;
          goto LAB_0011832f;
        }
        goto LAB_00118360;
      }
    }
    std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::erase
              (points,(const_iterator)__first._M_current,
               (points->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
               _M_impl.super__Vector_impl_data._M_finish);
    local_178 = uVar7 + 1;
  } while( true );
}

Assistant:

std::vector<cv::Point> cleanup_center_points(std::vector<cv::Point> points, const cv::Mat& img, bool debug)
{
    std::ptrdiff_t erase_count = 0;
    cv::RotatedRect ellipse;
    std::size_t iteration = 0;
    const constexpr std::size_t max_iteration = 8;
    const constexpr double step = 0.03;
    const constexpr double lower_start = 0.48 - (step * double(max_iteration));
    const constexpr double upper_start = 0.58 + (step * double(max_iteration));
    while(iteration < 12 && points.size() > 5)
    {
        ellipse = cv::fitEllipse(points);

        if(debug)
        {
            auto tmp = img.clone();
            cv::drawContours(tmp, std::vector<std::vector<cv::Point>> {points}, 0, cv::Scalar(255, 0, 0), 3);
            cv::ellipse(tmp, ellipse, cv::Scalar(0, 255, 0), 3);
            cv::namedWindow("Cleanup", cv::WINDOW_NORMAL);
            cv::imshow("Cleanup", tmp);
            cv::waitKey(0);
            cv::destroyAllWindows();
        }

        auto lower_threshold = ellipse.size.width * (lower_start + step * std::min(iteration, max_iteration));
        auto upper_threshold = ellipse.size.width * (upper_start - step * std::min(iteration, max_iteration));

        cv::Point center = ellipse.center;

        auto it = std::remove_if(
            points.begin(), points.end(), [center, lower_threshold, upper_threshold](const cv::Point& p) {
                auto dis = euclideanDistance(p, center);
                return dis < lower_threshold || dis > upper_threshold;
            });
        erase_count = std::distance(it, points.end());
        points.erase(it, points.end());
        iteration++;
    }
    return points;
}